

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_stable_compact(REF_NODE ref_node,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  int iVar1;
  REF_INT *pRVar2;
  ulong uVar3;
  REF_INT *pRVar4;
  int iVar5;
  undefined8 uVar6;
  char *pcVar7;
  ulong uVar8;
  
  uVar8 = (ulong)ref_node->max;
  if ((long)uVar8 < 0) {
    pcVar7 = "malloc *o2n_ptr of REF_INT negative";
    uVar6 = 0x34d;
  }
  else {
    pRVar2 = (REF_INT *)malloc(uVar8 * 4);
    *o2n_ptr = pRVar2;
    if (pRVar2 == (REF_INT *)0x0) {
      pcVar7 = "malloc *o2n_ptr of REF_INT NULL";
      uVar6 = 0x34d;
LAB_00131242:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
             "ref_node_stable_compact",pcVar7);
      return 2;
    }
    for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      pRVar2[uVar3] = -1;
    }
    iVar1 = ref_node->n;
    if ((long)iVar1 < 0) {
      pcVar7 = "malloc *n2o_ptr of REF_INT negative";
      uVar6 = 0x34f;
    }
    else {
      pRVar4 = (REF_INT *)malloc((long)iVar1 * 4);
      *n2o_ptr = pRVar4;
      if (pRVar4 == (REF_INT *)0x0) {
        pcVar7 = "malloc *n2o_ptr of REF_INT NULL";
        uVar6 = 0x34f;
        goto LAB_00131242;
      }
      iVar5 = 0;
      for (uVar3 = 0; uVar3 < uVar8; uVar3 = uVar3 + 1) {
        if (-1 < ref_node->global[uVar3]) {
          pRVar2[uVar3] = iVar5;
          iVar5 = iVar5 + 1;
        }
      }
      if (iVar5 == iVar1) {
        for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
          if (-1 < ref_node->global[uVar3]) {
            pRVar4[pRVar2[uVar3]] = (REF_INT)uVar3;
          }
        }
        return 0;
      }
      pcVar7 = "nnode miscount";
      uVar6 = 0x359;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
         "ref_node_stable_compact",pcVar7);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_node_stable_compact(REF_NODE ref_node, REF_INT **o2n_ptr,
                                           REF_INT **n2o_ptr) {
  REF_INT node;
  REF_INT nnode;
  REF_INT *o2n, *n2o;

  ref_malloc_init(*o2n_ptr, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  o2n = *o2n_ptr;
  ref_malloc(*n2o_ptr, ref_node_n(ref_node), REF_INT);
  n2o = *n2o_ptr;

  nnode = 0;

  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    nnode++;
  }

  RES(nnode, ref_node_n(ref_node), "nnode miscount");

  each_ref_node_valid_node(ref_node, node) n2o[o2n[node]] = node;

  return REF_SUCCESS;
}